

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

Gia_Man_t * Gia_ManBmcDupCone(Gia_Man_t *p,Vec_Int_t *vIns,Vec_Int_t *vNodes,Vec_Int_t *vOuts)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar4;
  int iVar5;
  
  p_00 = Vec_IntAlloc(vIns->nSize);
  for (iVar5 = 0; iVar5 < vIns->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vIns,iVar5);
    pGVar3 = Gia_ManObj(p,iVar1);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    Vec_IntPush(p_00,pGVar3->Value);
  }
  p_01 = Vec_IntAlloc(vNodes->nSize);
  for (iVar5 = 0; iVar5 < vNodes->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vNodes,iVar5);
    pGVar3 = Gia_ManObj(p,iVar1);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    Vec_IntPush(p_01,pGVar3->Value);
  }
  pGVar4 = Gia_ManDupFromVecs(p,vIns,vNodes,vOuts,0);
  for (iVar5 = 0; iVar5 < vIns->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vIns,iVar5);
    pGVar3 = Gia_ManObj(p,iVar1);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar2 = Vec_IntEntry(p_00,iVar5);
    pGVar3->Value = uVar2;
  }
  for (iVar5 = 0; iVar5 < vNodes->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vNodes,iVar5);
    pGVar3 = Gia_ManObj(p,iVar1);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar2 = Vec_IntEntry(p_01,iVar5);
    pGVar3->Value = uVar2;
  }
  for (iVar5 = 0; iVar5 < vOuts->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vOuts,iVar5);
    pGVar3 = Gia_ManObj(p,iVar1);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    pGVar3->Value = 0;
  }
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  return pGVar4;
}

Assistant:

Gia_Man_t * Gia_ManBmcDupCone( Gia_Man_t * p, Vec_Int_t * vIns, Vec_Int_t * vNodes, Vec_Int_t * vOuts )
{
    Gia_Man_t * pNew;
    Vec_Int_t * vTempIn, * vTempNode;
    Gia_Obj_t * pObj;
    int i;
    // save values
    vTempIn = Vec_IntAlloc( Vec_IntSize(vIns) );
    Gia_ManForEachObjVec( vIns, p, pObj, i )
        Vec_IntPush( vTempIn, pObj->Value );
    // save values
    vTempNode = Vec_IntAlloc( Vec_IntSize(vNodes) );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        Vec_IntPush( vTempNode, pObj->Value );
    // derive new GIA
    pNew = Gia_ManDupFromVecs( p, vIns, vNodes, vOuts, 0 );
    // reset values
    Gia_ManForEachObjVec( vIns, p, pObj, i )
        pObj->Value = Vec_IntEntry( vTempIn, i );
    // reset values
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->Value = Vec_IntEntry( vTempNode, i );
    // reset values
    Gia_ManForEachObjVec( vOuts, p, pObj, i )
        pObj->Value = 0;
    Vec_IntFree( vTempIn );
    Vec_IntFree( vTempNode );
    return pNew;
}